

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfmt.hpp
# Opt level: O0

void cpptrace::microfmt::detail::do_write<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
               (string *out,
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     end,format_options *options)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  char *local_d0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  char *local_a8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  char *local_90;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  char *local_70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  char *local_60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  size_type local_48;
  size_type out_size;
  char *local_38;
  ulong local_30;
  difference_type size;
  format_options *options_local;
  string *out_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin_local;
  
  size = (difference_type)options;
  options_local = (format_options *)out;
  out_local = (string *)end._M_current;
  end_local = begin;
  local_30 = __gnu_cxx::operator-
                       ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&out_local,&end_local);
  if (local_30 < *(ulong *)(size + 8)) {
    local_48 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          options_local);
    std::__cxx11::string::resize((ulong)options_local);
    if (*(int *)size == 0) {
      local_50._M_current = end_local._M_current;
      local_58._M_current = (char *)out_local;
      local_68._M_current =
           (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         options_local);
      local_60 = (char *)__gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator+(&local_68,local_48);
      local_70 = (char *)std::
                         copy<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                                   (local_50,local_58,
                                    (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )local_60);
      local_88._M_current =
           (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         options_local);
      local_80 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&local_88,local_48);
      local_78 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&local_80,local_30);
      local_90 = (char *)std::__cxx11::string::end();
      std::fill<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (local_78,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )local_90,(char *)(size + 4));
    }
    else {
      local_a0._M_current =
           (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         options_local);
      local_98 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&local_a0,local_48);
      local_b8._M_current =
           (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         options_local);
      local_b0 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&local_b8,local_48);
      local_a8 = (char *)__gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator+(&local_b0,*(long *)(size + 8) - local_30);
      std::fill<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (local_98,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )local_a8,(char *)(size + 4));
      local_c0._M_current = end_local._M_current;
      local_c8._M_current = (char *)out_local;
      local_e0._M_current =
           (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         options_local);
      local_d8 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&local_e0,local_48);
      local_d0 = (char *)__gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator+(&local_d8,*(long *)(size + 8) - local_30);
      std::
      copy<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (local_c0,local_c8,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_d0);
    }
  }
  else {
    local_38 = end_local._M_current;
    out_size = (size_type)out_local;
    std::__cxx11::string::append<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((string *)options_local,end_local,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )out_local);
  }
  return;
}

Assistant:

void do_write(std::string& out, It begin, It end, const format_options& options) {
            auto size = end - begin;
            if(static_cast<std::size_t>(size) >= options.width) {
                out.append(begin, end);
            } else {
                auto out_size = out.size();
                out.resize(out_size + options.width);
                if(options.align == alignment::left) {
                    std::copy(begin, end, out.begin() + out_size);
                    std::fill(out.begin() + out_size + size, out.end(), options.fill);
                } else {
                    std::fill(out.begin() + out_size, out.begin() + out_size + (options.width - size), options.fill);
                    std::copy(begin, end, out.begin() + out_size + (options.width - size));
                }
            }
        }